

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool * __thiscall
SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
          (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  uVar3 = this->bucketCount;
  uVar1 = uVar3 - 1;
  uVar4 = *key * -0x61c88647;
  iVar5 = 0;
  while( true ) {
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) {
      return (bool *)0x0;
    }
    uVar4 = uVar4 & uVar1;
    uVar2 = this->data[uVar4].key;
    if (uVar2 == 0) break;
    if (uVar2 == *key) {
      return &this->data[uVar4].value;
    }
    uVar4 = uVar4 + iVar5 + 1;
    iVar5 = iVar5 + 1;
  }
  return (bool *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}